

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorAction.cpp
# Opt level: O0

void __thiscall QColorActionPrivate::~QColorActionPrivate(QColorActionPrivate *this)

{
  QColorActionPrivate *in_RDI;
  
  ~QColorActionPrivate(in_RDI);
  operator_delete(in_RDI,0x48);
  return;
}

Assistant:

class QColorActionPrivate : public QObject {
    Q_OBJECT

public:
    explicit QColorActionPrivate(QColorAction *actionP)
        : QObject(actionP)
        , action(actionP)
        , options() {
        Q_ASSERT(action);

        connect(action, &QAction::triggered, this, &QColorActionPrivate::triggered);
    }

    void triggered() {
        const QColor newColor =
            QColorDialog::getColor(color, nullptr, caption, QColorDialog::ColorDialogOptions(int(options)));

        if (newColor.isValid()) {
            action->setColor(newColor);
        }
    }